

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.cpp
# Opt level: O1

int duckdb::History::Save(char *filename)

{
  __mode_t __mask;
  int iVar1;
  FILE *__stream;
  ulong uVar2;
  
  __mask = umask(0x7f);
  __stream = fopen(filename,"w");
  umask(__mask);
  if (__stream == (FILE *)0x0) {
    iVar1 = -1;
  }
  else {
    chmod(filename,0x180);
    if (history_len != 0) {
      uVar2 = 0;
      do {
        fprintf(__stream,"%s\n",*(undefined8 *)(history + uVar2 * 8));
        uVar2 = uVar2 + 1;
      } while (uVar2 < history_len);
    }
    fclose(__stream);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int History::Save(const char *filename) {
	mode_t old_umask = umask(S_IXUSR | S_IRWXG | S_IRWXO);
	FILE *fp;

	fp = fopen(filename, "w");
	umask(old_umask);
	if (fp == nullptr) {
		return -1;
	}
	chmod(filename, S_IRUSR | S_IWUSR);
	for (idx_t j = 0; j < history_len; j++) {
		fprintf(fp, "%s\n", history[j]);
	}
	fclose(fp);
	return 0;
}